

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O3

void RunManyThreads(_func_void *fn,int count)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/testutil.cc:87:13)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/testutil.cc:87:13)>
             ::_M_manager;
  local_30._M_unused._M_function_pointer = fn;
  RunMany((function<void_(int)> *)&local_30,count);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void RunManyThreads(void (*fn)(), int count) {
    RunMany([fn] (int dummy) {
      fn();
    }, count);
  }